

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O3

Version * glslang::GetVersion(void)

{
  Version *in_RDI;
  
  in_RDI->major = 0xf;
  in_RDI->minor = 2;
  in_RDI->patch = 0;
  in_RDI->flavor = "";
  return in_RDI;
}

Assistant:

Version GetVersion()
{
    Version version;
    version.major = GLSLANG_VERSION_MAJOR;
    version.minor = GLSLANG_VERSION_MINOR;
    version.patch = GLSLANG_VERSION_PATCH;
    version.flavor = GLSLANG_VERSION_FLAVOR;
    return version;
}